

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O1

FT_Error sfnt_init_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  byte *pbVar1;
  FT_Library library;
  uchar *puVar2;
  uchar *puVar3;
  uint uVar4;
  ushort uVar5;
  bool bVar6;
  byte bVar7;
  FT_UShort FVar8;
  FT_UShort FVar9;
  int iVar10;
  FT_Error FVar11;
  uint uVar12;
  uint extraout_EAX;
  int iVar13;
  undefined8 *puVar14;
  FT_Pointer pvVar15;
  FT_Module pFVar16;
  FT_ULong FVar17;
  FT_ULong FVar18;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  undefined6 extraout_var_01;
  FT_Stream pFVar19;
  FT_Stream_IoFunc p_Var20;
  FT_ULong *pFVar21;
  FT_Byte *pFVar22;
  uchar *puVar23;
  FT_Memory pFVar24;
  uint uVar25;
  int iVar26;
  FT_Stream pFVar27;
  FT_Stream_IoFunc *pp_Var28;
  ulong uVar29;
  uchar *puVar30;
  FT_Memory pFVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  FT_Error error_1;
  FT_Error error;
  WOFF_HeaderRec woff;
  uint local_fc;
  FT_Byte *local_f8;
  uint local_ec;
  undefined8 local_e8;
  FT_ULong local_e0;
  uint local_d4;
  FT_Memory local_d0;
  FT_Stream local_c8;
  FT_Memory local_c0;
  undefined8 local_b8;
  uchar *local_b0;
  TTC_HeaderRec *local_a8;
  uchar *local_a0;
  ulong local_98;
  FT_Byte local_90;
  FT_Byte FStack_8f;
  FT_Byte FStack_8e;
  FT_Byte FStack_8d;
  undefined4 uStack_8c;
  uchar *local_88;
  undefined2 local_80;
  uchar *local_78;
  uchar *local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  library = (((face->root).driver)->root).library;
  puVar14 = (undefined8 *)face->sfnt;
  if (puVar14 == (undefined8 *)0x0) {
    puVar14 = (undefined8 *)FT_Get_Module_Interface(library,"sfnt");
    if (puVar14 == (undefined8 *)0x0) {
      return 0xb;
    }
    face->sfnt = puVar14;
    face->goto_table = (TT_Loader_GotoTableFunc)*puVar14;
  }
  pvVar15 = ft_module_get_service(&((face->root).driver)->root,"postscript-cmaps",'\x01');
  face->psnames = pvVar15;
  if (face->mm == (void *)0x0) {
    pFVar16 = FT_Get_Module(library,"truetype");
    pvVar15 = ft_module_get_service(pFVar16,"multi-masters",'\0');
    face->mm = pvVar15;
  }
  local_d4 = face_instance_index;
  if (face->var == (void *)0x0) {
    pFVar16 = FT_Get_Module(library,"truetype");
    pvVar15 = ft_module_get_service(pFVar16,"metrics-variations",'\0');
    face->var = pvVar15;
  }
  pFVar24 = stream->memory;
  (face->ttc_header).tag = 0;
  (face->ttc_header).version = 0;
  (face->ttc_header).count = 0;
  FVar17 = FT_Stream_Pos(stream);
  FVar18 = FT_Stream_ReadULong(stream,(FT_Error *)&local_ec);
  uVar32 = local_ec;
  if (local_ec == 0) {
    local_a8 = &face->ttc_header;
LAB_0015e5d1:
    if (FVar18 == 0x774f4646) {
      local_ec = FT_Stream_Seek(stream,FVar17);
      uVar32 = local_ec;
      if (local_ec == 0) {
        pFVar31 = stream->memory;
        local_fc = 0;
        local_fc = FT_Stream_ReadFields
                             (stream,(FT_Frame_Field *)woff_open_font_woff_header_fields,&local_98);
        uVar32 = local_fc;
        if (local_fc == 0) {
          uVar32 = 8;
          lVar34 = CONCAT44(uStack_8c,
                            CONCAT13(FStack_8d,CONCAT12(FStack_8e,CONCAT11(FStack_8f,local_90))));
          if (((((((lVar34 != 0x74746366) && (lVar34 != 0x774f4646)) &&
                 (local_80 != 0 && local_88 == (uchar *)stream->size)) &&
                (((uchar *)((ulong)local_80 * 0x14 + 0x2c) < local_88 &&
                 (puVar30 = (uchar *)((ulong)local_80 << 4 | 0xc),
                 ((ulong)local_78 & 3) == 0 && puVar30 < local_78)))) &&
               ((local_68 != (uchar *)0x0 || (local_58 == 0 && local_60 == 0)))) &&
              ((local_60 == 0 || (local_58 != 0)))) && ((local_50 != 0 || (local_48 == 0)))) {
            local_c0 = (FT_Memory)ft_mem_alloc(pFVar31,(FT_Long)puVar30,(FT_Error *)&local_fc);
            if (local_fc == 0) {
              local_b8 = (FT_Stream)ft_mem_alloc(pFVar31,0x50,(FT_Error *)&local_fc);
              if (local_fc != 0) goto LAB_0015e777;
              uVar5 = local_80 >> 1;
              if (uVar5 == 0) {
                bVar7 = 0x20;
              }
              else {
                iVar10 = 0x1f;
                if (uVar5 != 0) {
                  for (; uVar5 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                  }
                }
                bVar7 = (byte)iVar10 ^ 0x1f;
              }
              bVar7 = 0x20 - bVar7 | (byte)-(uint)(local_80 == 0);
              iVar10 = 0x10 << (bVar7 & 0x1f);
              iVar26 = (uint)local_80 * 0x10 - iVar10;
              *(FT_Byte *)local_c0 = FStack_8d;
              *(FT_Byte *)((long)local_c0 + 1) = FStack_8e;
              *(FT_Byte *)((long)local_c0 + 2) = FStack_8f;
              *(FT_Byte *)((long)local_c0 + 3) = local_90;
              *(FT_Byte *)((long)local_c0 + 4) = local_80._1_1_;
              *(FT_Byte *)((long)local_c0 + 5) = (FT_Byte)local_80;
              *(FT_Byte *)((long)local_c0 + 6) = (FT_Byte)((uint)iVar10 >> 8);
              *(FT_Byte *)((long)local_c0 + 7) = (FT_Byte)iVar10;
              *(FT_Byte *)((long)local_c0 + 8) = (FT_Byte)(-(uint)(local_80 == 0) >> 8);
              *(byte *)((long)local_c0 + 9) = bVar7;
              *(FT_Byte *)((long)local_c0 + 10) = (FT_Byte)((uint)iVar26 >> 8);
              *(FT_Byte *)((long)local_c0 + 0xb) = (FT_Byte)iVar26;
              pFVar19 = (FT_Stream)
                        ft_mem_realloc(pFVar31,0x30,0,(ulong)local_80,(void *)0x0,
                                       (FT_Error *)&local_fc);
              if (local_fc == 0) {
                local_c8 = pFVar19;
                local_f8 = (FT_Byte *)
                           ft_mem_realloc(pFVar31,8,0,(ulong)local_80,(void *)0x0,
                                          (FT_Error *)&local_fc);
                pFVar19 = local_c8;
                pFVar22 = local_f8;
                if ((local_fc == 0) &&
                   (local_d0 = pFVar24,
                   local_fc = FT_Stream_EnterFrame(stream,(ulong)local_80 * 0x14),
                   pFVar24 = local_d0, pFVar19 = local_c8, pFVar22 = local_f8, local_fc == 0)) {
                  if (local_80 != 0) {
                    local_b0 = (uchar *)0x0;
                    local_e8 = (uchar *)0x0;
                    pFVar27 = local_c8;
                    do {
                      puVar30 = (uchar *)FT_Stream_GetULong(stream);
                      pFVar27->base = puVar30;
                      FVar17 = FT_Stream_GetULong(stream);
                      pFVar27->size = FVar17;
                      FVar17 = FT_Stream_GetULong(stream);
                      pFVar27->pos = FVar17;
                      FVar17 = FT_Stream_GetULong(stream);
                      (pFVar27->descriptor).value = FVar17;
                      FVar17 = FT_Stream_GetULong(stream);
                      (pFVar27->pathname).value = FVar17;
                      puVar30 = pFVar27->base;
                      if (local_e8 < puVar30) {
                        *(FT_Stream *)(local_f8 + (long)local_b0 * 8) = pFVar27;
                        puVar23 = puVar30;
                      }
                      else {
                        local_a0 = puVar30;
                        FT_Stream_ExitFrame(stream);
                        local_fc = 8;
                        puVar30 = local_e8;
                        puVar23 = local_a0;
                      }
                      pFVar24 = local_d0;
                      pFVar19 = local_c8;
                      pFVar22 = local_f8;
                      if (puVar23 <= local_e8) goto LAB_0015e77c;
                      local_b0 = local_b0 + 1;
                      pFVar27 = (FT_Stream)&pFVar27->close;
                      local_e8 = puVar30;
                    } while (local_b0 < (uchar *)(ulong)local_80);
                  }
                  FT_Stream_ExitFrame(stream);
                  qsort(local_f8,(ulong)local_80,8,compare_offsets);
                  local_b0 = (uchar *)((ulong)local_80 << 4 | 0xc);
                  puVar30 = (uchar *)((ulong)local_80 * 0x14 + 0x2c);
                  puVar23 = local_b0;
                  pFVar24 = local_d0;
                  pFVar19 = local_c8;
                  pFVar22 = local_f8;
                  if (local_80 != 0) {
                    local_e8 = local_78;
                    uVar29 = 0;
                    do {
                      lVar34 = *(long *)(local_f8 + uVar29 * 8);
                      if ((*(uchar **)(lVar34 + 8) == puVar30) &&
                         (puVar2 = *(uchar **)(lVar34 + 0x10),
                         *(uchar **)(lVar34 + 8) <= local_88 + -(long)puVar2 && puVar2 <= local_88))
                      {
                        puVar3 = *(uchar **)(lVar34 + 0x18);
                        if ((puVar3 < puVar2) ||
                           ((local_78 < puVar3 || (local_78 + -(long)puVar3 < puVar23))))
                        goto LAB_0015ea5c;
                        *(uchar **)(lVar34 + 0x28) = puVar23;
                        puVar30 = puVar30 + ((int)puVar2 + 3U & 0xfffffffc);
                        puVar23 = puVar23 + ((int)puVar3 + 3U & 0xfffffffc);
                        bVar6 = true;
                      }
                      else {
LAB_0015ea5c:
                        local_fc = 8;
                        bVar6 = false;
                      }
                      if (!bVar6) goto LAB_0015e77c;
                      uVar29 = uVar29 + 1;
                    } while (local_80 != uVar29);
                  }
                  if (local_68 == (uchar *)0x0) {
LAB_0015eaf2:
                    if (local_50 != 0) {
                      uVar29 = (ulong)((int)puVar30 + 3U & 0xfffffffc);
                      if ((local_50 != uVar29) || (local_88 < (uchar *)(local_50 + local_48)))
                      goto LAB_0015ed85;
                      puVar30 = (uchar *)(uVar29 + local_48);
                    }
                    if ((puVar23 == local_78) && (puVar30 == local_88)) {
                      local_c0 = (FT_Memory)
                                 ft_mem_realloc(pFVar31,1,(FT_Long)local_b0,(FT_Long)local_78,
                                                local_c0,(FT_Error *)&local_fc);
                      pFVar24 = local_d0;
                      pFVar19 = local_c8;
                      pFVar22 = local_f8;
                      if (local_fc == 0) {
                        if (local_80 != 0) {
                          local_b0 = (uchar *)((long)local_c0 + 0xc);
                          pp_Var28 = &local_c8->read;
                          local_a0 = (uchar *)0x0;
                          do {
                            *local_b0 = *(uchar *)((long)pp_Var28 + -0x25);
                            local_b0[1] = *(uchar *)((long)pp_Var28 + -0x26);
                            local_b0[2] = *(uchar *)((long)pp_Var28 + -0x27);
                            local_b0[3] = *(uchar *)&((FT_StreamRec_ *)(pp_Var28 + -5))->base;
                            local_b0[4] = *(uchar *)((long)pp_Var28 + -5);
                            local_b0[5] = *(uchar *)((long)pp_Var28 + -6);
                            local_b0[6] = *(uchar *)((long)pp_Var28 + -7);
                            local_b0[7] = *(uchar *)(pp_Var28 + -1);
                            local_b0[8] = *(uchar *)((long)pp_Var28 + 3);
                            local_b0[9] = *(uchar *)((long)pp_Var28 + 2);
                            local_b0[10] = *(uchar *)((long)pp_Var28 + 1);
                            local_b0[0xb] = *(uchar *)pp_Var28;
                            local_b0[0xc] = *(uchar *)((long)pp_Var28 + -0xd);
                            local_b0[0xd] = *(uchar *)((long)pp_Var28 + -0xe);
                            local_b0[0xe] = *(uchar *)((long)pp_Var28 + -0xf);
                            local_b0[0xf] = *(uchar *)(pp_Var28 + -2);
                            local_fc = FT_Stream_Seek(stream,(FT_ULong)pp_Var28[-4]);
                            p_Var20 = (FT_Stream_IoFunc)(ulong)local_fc;
                            local_e8 = (uchar *)CONCAT44(local_e8._4_4_,8);
                            if (local_fc == 0) {
                              local_fc = FT_Stream_EnterFrame(stream,(FT_ULong)pp_Var28[-3]);
                              p_Var20 = (FT_Stream_IoFunc)(ulong)local_fc;
                              if (local_fc == 0) {
                                if (pp_Var28[-3] ==
                                    (FT_Stream_IoFunc)((FT_StreamDesc *)(pp_Var28 + -2))->value) {
                                  memcpy(*pp_Var28 + (long)local_c0,stream->cursor,
                                         ((FT_StreamDesc *)(pp_Var28 + -2))->value);
                                }
                                else {
                                  local_e0 = ((FT_StreamDesc *)(pp_Var28 + -2))->value;
                                  local_fc = FT_Gzip_Uncompress(pFVar31,(FT_Byte *)
                                                                        (*pp_Var28 + (long)local_c0)
                                                                ,&local_e0,stream->cursor,
                                                                (FT_ULong)pp_Var28[-3]);
                                  puVar30 = local_e8;
                                  local_e8 = (uchar *)((ulong)local_e8 & 0xffffffff00000000);
                                  if (local_fc == 0) {
                                    p_Var20 = (FT_Stream_IoFunc)&DAT_00000001;
                                    if (local_e0 != ((FT_StreamDesc *)(pp_Var28 + -2))->value) {
                                      local_fc = 8;
                                      goto LAB_0015ecaa;
                                    }
                                  }
                                  else {
LAB_0015ecaa:
                                    p_Var20 = (FT_Stream_IoFunc)0x0;
                                    local_e8._4_4_ = SUB84(puVar30,4);
                                    local_e8 = (uchar *)CONCAT44(local_e8._4_4_,8);
                                  }
                                  if ((char)p_Var20 == '\0') goto LAB_0015ecff;
                                }
                                FT_Stream_ExitFrame(stream);
                                p_Var20 = *pp_Var28;
                                uVar32 = (uint)((FT_StreamDesc *)(pp_Var28 + -2))->value;
                                if ((uVar32 + (int)p_Var20 & 3) == 0) {
                                  local_e8 = (uchar *)((ulong)local_e8._4_4_ << 0x20);
                                }
                                else {
                                  local_e8 = (uchar *)((ulong)local_e8._4_4_ << 0x20);
                                  p_Var20 = (FT_Stream_IoFunc)
                                            memset((FT_Byte *)((long)local_c0 + (long)p_Var20) +
                                                   ((FT_StreamDesc *)(pp_Var28 + -2))->value,0,
                                                   (ulong)(~uVar32 - (int)p_Var20 & 3) + 1);
                                }
                              }
                            }
LAB_0015ecff:
                            if ((int)local_e8 != 0) {
                              pFVar24 = local_d0;
                              pFVar19 = local_c8;
                              pFVar22 = local_f8;
                              uVar32 = (uint)p_Var20;
                              if ((int)local_e8 == 8) goto LAB_0015e77c;
                              goto LAB_0015e61e;
                            }
                            local_a0 = local_a0 + 1;
                            pp_Var28 = pp_Var28 + 6;
                            local_b0 = local_b0 + 0x10;
                          } while (local_a0 < (uchar *)(ulong)local_80);
                        }
                        pFVar19 = local_b8;
                        FT_Stream_OpenMemory(local_b8,(FT_Byte *)local_c0,(FT_ULong)local_78);
                        pFVar19->memory = stream->memory;
                        pFVar19->close = sfnt_stream_close;
                        FT_Stream_Free((face->root).stream,(uint)(face->root).face_flags >> 10 & 1);
                        (face->root).stream = pFVar19;
                        pbVar1 = (byte *)((long)&(face->root).face_flags + 1);
                        *pbVar1 = *pbVar1 & 0xfb;
                        pFVar24 = local_d0;
                        pFVar19 = local_c8;
                        pFVar22 = local_f8;
                      }
                      goto LAB_0015e77c;
                    }
                  }
                  else if ((local_68 == puVar30) && (local_68 + local_60 <= local_88)) {
                    puVar30 = puVar30 + local_60;
                    goto LAB_0015eaf2;
                  }
LAB_0015ed85:
                  local_fc = 8;
                }
              }
              else {
                pFVar22 = (FT_Byte *)0x0;
              }
            }
            else {
              local_b8 = (FT_Stream)0x0;
LAB_0015e777:
              pFVar19 = (FT_Stream)0x0;
              pFVar22 = (FT_Byte *)0x0;
            }
LAB_0015e77c:
            ft_mem_free(pFVar31,pFVar19);
            ft_mem_free(pFVar31,pFVar22);
            uVar32 = local_fc;
            if (local_fc != 0) {
              ft_mem_free(pFVar31,local_c0);
              pFVar19 = local_b8;
              FT_Stream_Close(local_b8);
              ft_mem_free(pFVar31,pFVar19);
              uVar32 = local_fc;
            }
          }
        }
LAB_0015e61e:
        local_ec = uVar32;
        if (uVar32 == 0) goto code_r0x0015e62a;
      }
      goto LAB_0015e3fe;
    }
    uVar32 = 2;
    if ((long)FVar18 < 0x74746366) {
      if ((long)FVar18 < 0x4f54544f) {
        if ((FVar18 != 0x10000) && (FVar18 != 0x20000)) goto LAB_0015e3fe;
      }
      else if ((FVar18 != 0x4f54544f) && (FVar18 != 0x74727565)) goto LAB_0015e3fe;
    }
    else if ((long)FVar18 < 0xa56b6264) {
      if ((FVar18 != 0x74746366) && (FVar18 != 0x74797031)) goto LAB_0015e3fe;
    }
    else if ((FVar18 != 0xa56b6264) && (FVar18 != 0xa56c7374)) goto LAB_0015e3fe;
    local_a8->tag = 0x74746366;
    if (FVar18 == 0x74746366) {
      local_ec = FT_Stream_ReadFields
                           (stream,(FT_Frame_Field *)sfnt_open_font_ttc_header_fields,local_a8);
      uVar32 = local_ec;
      if (local_ec == 0) {
        uVar29 = (face->ttc_header).count;
        if (uVar29 == 0) {
          uVar32 = 8;
          goto LAB_0015ee65;
        }
        if (stream->size >> 5 < uVar29) {
          uVar32 = 10;
          goto LAB_0015ee65;
        }
        bVar6 = false;
        pFVar21 = (FT_ULong *)ft_mem_realloc(pFVar24,8,0,uVar29,(void *)0x0,(FT_Error *)&local_ec);
        (face->ttc_header).offsets = pFVar21;
        uVar32 = local_ec;
        if (local_ec == 0) {
          uVar32 = FT_Stream_EnterFrame(stream,(face->ttc_header).count << 2);
          local_ec = uVar32;
          if (uVar32 != 0) goto LAB_0015ee65;
          if (0 < (face->ttc_header).count) {
            lVar34 = 0;
            do {
              FVar17 = FT_Stream_GetULong(stream);
              (face->ttc_header).offsets[lVar34] = FVar17;
              lVar34 = lVar34 + 1;
            } while (lVar34 < (face->ttc_header).count);
          }
          FT_Stream_ExitFrame(stream);
          bVar6 = true;
          uVar32 = extraout_EAX;
        }
      }
      else {
LAB_0015ee65:
        bVar6 = false;
      }
      if (bVar6) {
LAB_0015eeb6:
        uVar32 = local_ec;
      }
    }
    else {
      (face->ttc_header).version = 0x10000;
      (face->ttc_header).count = 1;
      pFVar21 = (FT_ULong *)ft_mem_alloc(pFVar24,8,(FT_Error *)&local_ec);
      (face->ttc_header).offsets = pFVar21;
      uVar32 = local_ec;
      if (local_ec == 0) {
        *pFVar21 = FVar17;
        goto LAB_0015eeb6;
      }
    }
  }
LAB_0015e3fe:
  if (uVar32 != 0) {
    return uVar32;
  }
  uVar4 = -local_d4;
  if (0 < (int)local_d4) {
    uVar4 = local_d4;
  }
  pFVar19 = (face->root).stream;
  iVar10 = ((int)local_d4 >> 0x1f) + (uVar4 & 0xffff);
  if ((face->ttc_header).count <= (long)iVar10) {
    if (-1 < (int)local_d4) {
      return 6;
    }
    iVar10 = 0;
  }
  local_e0._0_4_ = uVar32;
  local_e0._0_4_ = FT_Stream_Seek(pFVar19,(face->ttc_header).offsets[iVar10]);
  if ((uint)local_e0 != 0) {
    return (uint)local_e0;
  }
  local_e0._0_4_ = (*(code *)puVar14[0x16])(face,pFVar19);
  if ((uint)local_e0 != 0) {
    return (uint)local_e0;
  }
  local_c0 = (face->root).memory;
  FVar11 = (*face->goto_table)(face,0x66766172,pFVar19,&local_98);
  if (((FVar11 == 0) && (0x13 < local_98)) &&
     (FVar17 = FT_Stream_ReadULong(pFVar19,(FT_Error *)&local_e0), (uint)local_e0 == 0)) {
    FVar8 = FT_Stream_ReadUShort(pFVar19,(FT_Error *)&local_e0);
    local_f8 = (FT_Byte *)CONCAT62(local_f8._2_6_,FVar8);
    if ((((uint)local_e0 != 0) || (local_e0._0_4_ = FT_Stream_Skip(pFVar19,2), (uint)local_e0 != 0))
       || (FVar8 = FT_Stream_ReadUShort(pFVar19,(FT_Error *)&local_e0), (uint)local_e0 != 0))
    goto LAB_0015e571;
    FVar9 = FT_Stream_ReadUShort(pFVar19,(FT_Error *)&local_e0);
    local_b8 = (FT_Stream)CONCAT62(extraout_var,FVar9);
    if ((uint)local_e0 != 0) goto LAB_0015e571;
    FVar9 = FT_Stream_ReadUShort(pFVar19,(FT_Error *)&local_e0);
    local_a8 = (TTC_HeaderRec *)CONCAT62(extraout_var_00,FVar9);
    if ((uint)local_e0 != 0) goto LAB_0015e571;
    FVar9 = FT_Stream_ReadUShort(pFVar19,(FT_Error *)&local_e0);
    uVar29 = CONCAT62(extraout_var_01,FVar9);
    if ((uint)local_e0 != 0) goto LAB_0015e571;
    pFVar24 = (FT_Memory)((ulong)local_f8 & 0xffff);
    pFVar27 = local_b8;
  }
  else {
LAB_0015e571:
    FVar17 = 0;
    pFVar24 = (FT_Memory)0x0;
    FVar8 = 0;
    local_a8 = (TTC_HeaderRec *)0x0;
    uVar29 = 0;
    pFVar27 = (FT_Stream)0x0;
  }
  pFVar31 = local_c0;
  if ((ushort)(FVar8 + 0xc001) < 0xc002 || ((short)pFVar27 != 0x14 || FVar17 != 0x10000)) {
    local_a8 = (TTC_HeaderRec *)0x0;
    goto LAB_0015efe4;
  }
  uVar12 = (uint)uVar29 & 0xffff;
  uVar32 = (uint)FVar8;
  uVar25 = (uint)local_a8;
  if (uVar32 * 4 + 4 == uVar12) {
    if ((uVar25 & 0xffff) < 0x7f00) {
LAB_0015efc3:
      if ((long)&pFVar24->user + (ulong)(uVar12 * (uVar25 & 0xffff)) + (ulong)(uVar32 * 0x14) <=
          local_98) {
        *(byte *)&face->variation_support = (byte)face->variation_support | 1;
        goto LAB_0015efe4;
      }
    }
  }
  else if ((uVar25 & 0xffff) < 0x7f00 && uVar32 * 4 + 6 == uVar12) goto LAB_0015efc3;
  local_a8 = (TTC_HeaderRec *)0x0;
LAB_0015efe4:
  if ((face->variation_support & 1) == 0) {
    pFVar22 = (FT_Byte *)0x0;
    puVar23 = (uchar *)0x0;
  }
  else {
    puVar30 = (uchar *)(ulong)((uint)FVar8 * 4);
    local_d0 = pFVar24;
    local_b8 = pFVar27;
    local_a0 = (uchar *)(ulong)FVar8;
    local_38 = uVar29;
    pFVar22 = (FT_Byte *)ft_mem_alloc(local_c0,(FT_Long)puVar30,(FT_Error *)&local_e0);
    if ((uint)local_e0 == 0) {
      local_f8 = pFVar22;
      puVar23 = (uchar *)ft_mem_alloc(pFVar31,(FT_Long)puVar30,(FT_Error *)&local_e0);
      pFVar22 = local_f8;
      pFVar31 = local_c0;
      local_e8 = puVar23;
      if ((uint)local_e0 == 0) {
        local_40 = (ulong)local_b8 & 0xffff;
        local_b0 = puVar30;
        FVar17 = FT_Stream_Pos(pFVar19);
        pFVar24 = (FT_Memory)((long)local_d0 + (FVar17 - 0x10));
        if ((int)local_a0 != 0) {
          FVar17 = (long)local_d0 + (FVar17 - 8);
          local_b8 = (FT_Stream)(local_40 & 0xffffffff);
          uVar29 = (ulong)local_a0 & 0xffffffff;
          pFVar22 = local_f8;
          local_d0 = pFVar24;
          do {
            local_e0._0_4_ = FT_Stream_ReadAt(pFVar19,FVar17,pFVar22,4);
            FVar17 = (long)&local_b8->base + FVar17;
            pFVar22 = pFVar22 + 4;
            uVar32 = (int)uVar29 - 1;
            uVar29 = (ulong)uVar32;
            pFVar24 = local_d0;
          } while (uVar32 != 0);
        }
        local_d0 = pFVar24;
        pFVar22 = local_e8;
        iVar10 = (int)local_a8;
        local_b8 = (FT_Stream)(CONCAT44(local_b8._4_4_,iVar10) & 0xffffffff0000ffff);
        if ((short)local_a8 == 0) {
          iVar26 = 0;
        }
        else {
          puVar30 = (uchar *)((long)&local_d0->user +
                             (ulong)(uint)((int)local_40 * (int)local_a0) + 4);
          local_a0 = (uchar *)(local_38 & 0xffff);
          iVar33 = 0;
          local_c8 = pFVar19;
          do {
            puVar23 = local_b0;
            local_e0._0_4_ = FT_Stream_ReadAt(local_c8,(FT_ULong)puVar30,pFVar22,(FT_ULong)local_b0)
            ;
            iVar13 = bcmp(local_f8,pFVar22,(size_t)puVar23);
            iVar10 = (int)local_a8;
            pFVar19 = local_c8;
            iVar26 = iVar33;
            if (iVar13 == 0) break;
            puVar30 = puVar30 + (long)local_a0;
            iVar33 = iVar33 + 1;
            iVar26 = (int)local_b8;
          } while ((int)local_b8 != iVar33);
        }
        local_a8 = (TTC_HeaderRec *)(ulong)(iVar10 + (uint)(iVar26 == (int)local_b8));
        pFVar22 = local_f8;
        pFVar31 = local_c0;
        puVar23 = local_e8;
      }
    }
    else {
      puVar23 = (uchar *)0x0;
    }
  }
  uVar32 = local_d4;
  ft_mem_free(pFVar31,pFVar22);
  ft_mem_free(pFVar31,puVar23);
  FVar11 = (*face->goto_table)(face,0x676c7966,pFVar19,(FT_ULong *)0x0);
  if ((FVar11 == 0) ||
     (FVar11 = (*face->goto_table)(face,0x43464632,pFVar19,(FT_ULong *)0x0), FVar11 == 0)) {
    uVar25 = (uint)local_a8;
  }
  else {
    FVar11 = (*face->goto_table)(face,0x43464620,pFVar19,(FT_ULong *)0x0);
    uVar25 = (uint)local_a8;
    if (FVar11 == 0) {
      uVar25 = 0;
    }
  }
  if ((uVar25 & 0xffff) < uVar4 >> 0x10) {
    if (-1 < (int)uVar32) {
      return 6;
    }
    uVar25 = 0;
  }
  (face->root).style_flags = (ulong)(uVar25 << 0x10);
  (face->root).num_faces = (face->ttc_header).count;
  (face->root).face_index = (long)(int)uVar32;
  return (uint)local_e0;
code_r0x0015e62a:
  stream = (face->root).stream;
  FVar17 = FT_Stream_Pos(stream);
  FVar18 = FT_Stream_ReadULong(stream,(FT_Error *)&local_ec);
  uVar32 = local_ec;
  if (local_ec != 0) goto LAB_0015e3fe;
  goto LAB_0015e5d1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_init_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error      error;
    FT_Library    library = face->root.driver->root.library;
    SFNT_Service  sfnt;
    FT_Int        face_index;


    /* for now, parameters are unused */
    FT_UNUSED( num_params );
    FT_UNUSED( params );


    sfnt = (SFNT_Service)face->sfnt;
    if ( !sfnt )
    {
      sfnt = (SFNT_Service)FT_Get_Module_Interface( library, "sfnt" );
      if ( !sfnt )
      {
        FT_ERROR(( "sfnt_init_face: cannot access `sfnt' module\n" ));
        return FT_THROW( Missing_Module );
      }

      face->sfnt       = sfnt;
      face->goto_table = sfnt->goto_table;
    }

    FT_FACE_FIND_GLOBAL_SERVICE( face, face->psnames, POSTSCRIPT_CMAPS );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( !face->mm )
    {
      /* we want the MM interface from the `truetype' module only */
      FT_Module  tt_module = FT_Get_Module( library, "truetype" );


      face->mm = ft_module_get_service( tt_module,
                                        FT_SERVICE_ID_MULTI_MASTERS,
                                        0 );
    }

    if ( !face->var )
    {
      /* we want the metrics variations interface */
      /* from the `truetype' module only          */
      FT_Module  tt_module = FT_Get_Module( library, "truetype" );


      face->var = ft_module_get_service( tt_module,
                                         FT_SERVICE_ID_METRICS_VARIATIONS,
                                         0 );
    }
#endif

    FT_TRACE2(( "SFNT driver\n" ));

    error = sfnt_open_font( stream, face );
    if ( error )
      return error;

    /* Stream may have changed in sfnt_open_font. */
    stream = face->root.stream;

    FT_TRACE2(( "sfnt_init_face: %08p, %d\n", face, face_instance_index ));

    face_index = FT_ABS( face_instance_index ) & 0xFFFF;

    /* value -(N+1) requests information on index N */
    if ( face_instance_index < 0 )
      face_index--;

    if ( face_index >= face->ttc_header.count )
    {
      if ( face_instance_index >= 0 )
        return FT_THROW( Invalid_Argument );
      else
        face_index = 0;
    }

    if ( FT_STREAM_SEEK( face->ttc_header.offsets[face_index] ) )
      return error;

    /* check whether we have a valid TrueType file */
    error = sfnt->load_font_dir( face, stream );
    if ( error )
      return error;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    {
      FT_Memory  memory = face->root.memory;

      FT_ULong  fvar_len;

      FT_ULong  version;
      FT_ULong  offset;

      FT_UShort  num_axes;
      FT_UShort  axis_size;
      FT_UShort  num_instances;
      FT_UShort  instance_size;

      FT_Int  instance_index;

      FT_Byte*  default_values  = NULL;
      FT_Byte*  instance_values = NULL;


      instance_index = FT_ABS( face_instance_index ) >> 16;

      /* test whether current face is a GX font with named instances */
      if ( face->goto_table( face, TTAG_fvar, stream, &fvar_len ) ||
           fvar_len < 20                                          ||
           FT_READ_ULONG( version )                               ||
           FT_READ_USHORT( offset )                               ||
           FT_STREAM_SKIP( 2 ) /* reserved */                     ||
           FT_READ_USHORT( num_axes )                             ||
           FT_READ_USHORT( axis_size )                            ||
           FT_READ_USHORT( num_instances )                        ||
           FT_READ_USHORT( instance_size )                        )
      {
        version       = 0;
        offset        = 0;
        num_axes      = 0;
        axis_size     = 0;
        num_instances = 0;
        instance_size = 0;
      }

      /* check that the data is bound by the table length */
      if ( version != 0x00010000UL                    ||
           axis_size != 20                            ||
           num_axes == 0                              ||
           /* `num_axes' limit implied by 16-bit `instance_size' */
           num_axes > 0x3FFE                          ||
           !( instance_size == 4 + 4 * num_axes ||
              instance_size == 6 + 4 * num_axes )     ||
           /* `num_instances' limit implied by limited range of name IDs */
           num_instances > 0x7EFF                     ||
           offset                          +
             axis_size * num_axes          +
             instance_size * num_instances > fvar_len )
        num_instances = 0;
      else
        face->variation_support |= TT_FACE_FLAG_VAR_FVAR;

      /*
       *  As documented in the OpenType specification, an entry for the
       *  default instance may be omitted in the named instance table.  In
       *  particular this means that even if there is no named instance
       *  table in the font we actually do have a named instance, namely the
       *  default instance.
       *
       *  For consistency, we always want the default instance in our list
       *  of named instances.  If it is missing, we try to synthesize it
       *  later on.  Here, we have to adjust `num_instances' accordingly.
       */

      if ( ( face->variation_support & TT_FACE_FLAG_VAR_FVAR ) &&
           !( FT_ALLOC( default_values, num_axes * 4 )  ||
              FT_ALLOC( instance_values, num_axes * 4 ) )      )
      {
        /* the current stream position is 16 bytes after the table start */
        FT_ULong  array_start = FT_STREAM_POS() - 16 + offset;
        FT_ULong  default_value_offset, instance_offset;

        FT_Byte*  p;
        FT_UInt   i;


        default_value_offset = array_start + 8;
        p                    = default_values;

        for ( i = 0; i < num_axes; i++ )
        {
          (void)FT_STREAM_READ_AT( default_value_offset, p, 4 );

          default_value_offset += axis_size;
          p                    += 4;
        }

        instance_offset = array_start + axis_size * num_axes + 4;

        for ( i = 0; i < num_instances; i++ )
        {
          (void)FT_STREAM_READ_AT( instance_offset,
                                   instance_values,
                                   num_axes * 4 );

          if ( !ft_memcmp( default_values, instance_values, num_axes * 4 ) )
            break;

          instance_offset += instance_size;
        }

        if ( i == num_instances )
        {
          /* no default instance in named instance table; */
          /* we thus have to synthesize it                */
          num_instances++;
        }
      }

      FT_FREE( default_values );
      FT_FREE( instance_values );

      /* we don't support Multiple Master CFFs yet; */
      /* note that `glyf' or `CFF2' have precedence */
      if ( face->goto_table( face, TTAG_glyf, stream, 0 ) &&
           face->goto_table( face, TTAG_CFF2, stream, 0 ) &&
           !face->goto_table( face, TTAG_CFF, stream, 0 ) )
        num_instances = 0;

      /* instance indices in `face_instance_index' start with index 1, */
      /* thus `>' and not `>='                                         */
      if ( instance_index > num_instances )
      {
        if ( face_instance_index >= 0 )
          return FT_THROW( Invalid_Argument );
        else
          num_instances = 0;
      }

      face->root.style_flags = (FT_Long)num_instances << 16;
    }
#endif

    face->root.num_faces  = face->ttc_header.count;
    face->root.face_index = face_instance_index;

    return error;
  }